

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::potentialInterfacesStartupSequence(Federate *this)

{
  uint uVar1;
  bool bVar2;
  size_t *psVar3;
  element_type *peVar4;
  PotentialInterfacesManager *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cmd;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_000002f8;
  PotentialInterfacesManager *in_stack_00000300;
  type in_stack_fffffffffffffdf8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  size_t *__rtime;
  undefined1 local_1a0 [132];
  uint local_11c;
  undefined1 local_118 [84];
  int local_c4;
  duration<long,std::ratio<1l,1000l>> local_c0 [12];
  uint local_b4;
  undefined1 local_b0 [64];
  uint local_70;
  uint local_6c;
  int local_5c;
  memory_order local_58;
  int local_54;
  size_t *local_50;
  undefined4 local_48;
  memory_order local_44;
  int local_40;
  undefined4 local_3c;
  size_t *local_38;
  undefined4 local_30;
  memory_order local_2c;
  int local_28;
  undefined4 local_24;
  size_t *local_20;
  undefined4 local_18;
  memory_order local_14;
  int local_10;
  undefined4 local_c;
  size_t *local_8;
  
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                      *)0x33f495);
  if (!bVar2) {
    return;
  }
  __rtime = &(in_RDI->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_54 = 5;
  local_50 = __rtime;
  local_58 = CLI::std::operator&(seq_cst,__memory_order_mask);
  if (local_54 - 1U < 2) {
    local_5c = (int)*__rtime;
  }
  else if (local_54 == 5) {
    local_5c = (int)*__rtime;
  }
  else {
    local_5c = (int)*__rtime;
  }
  if (local_5c == 0) {
    std::
    unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
    ::operator->((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                  *)0x33f56c);
    PotentialInterfacesManager::initialize(in_RDI);
    psVar3 = &(in_RDI->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_c = 1;
    local_10 = 5;
    local_8 = psVar3;
    local_14 = CLI::std::operator&(seq_cst,__memory_order_mask);
    local_18 = local_c;
    if (local_10 == 3) {
      *(undefined4 *)psVar3 = local_c;
    }
    else if (local_10 == 5) {
      LOCK();
      *(undefined4 *)psVar3 = local_c;
      UNLOCK();
    }
    else {
      *(undefined4 *)psVar3 = local_c;
    }
  }
  else if (local_5c != 1) {
    if (local_5c != 2) {
      return;
    }
    goto LAB_0033f6fa;
  }
  peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x33f629);
  local_6c._0_1_ = in_RDI->respondedToCommand;
  local_6c._1_1_ = in_RDI->hasPotentialTargetting;
  local_6c._2_2_ = *(undefined2 *)&in_RDI->field_0x12;
  (*peVar4->_vptr_Core[0x13])(peVar4,(ulong)local_6c,1);
  psVar3 = &(in_RDI->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_24 = 2;
  local_28 = 5;
  local_20 = psVar3;
  local_2c = CLI::std::operator&(seq_cst,__memory_order_mask);
  local_30 = local_24;
  if (local_28 == 3) {
    *(undefined4 *)psVar3 = local_24;
  }
  else if (local_28 == 5) {
    LOCK();
    *(undefined4 *)psVar3 = local_24;
    UNLOCK();
  }
  else {
    *(undefined4 *)psVar3 = local_24;
  }
LAB_0033f6fa:
  peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x33f708);
  local_70._0_1_ = in_RDI->respondedToCommand;
  local_70._1_1_ = in_RDI->hasPotentialTargetting;
  local_70._2_2_ = *(undefined2 *)&in_RDI->field_0x12;
  (*peVar4->_vptr_Core[0x13])(peVar4,(ulong)local_70,1);
  peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x33f73d);
  local_b4._0_1_ = in_RDI->respondedToCommand;
  local_b4._1_1_ = in_RDI->hasPotentialTargetting;
  local_b4._2_2_ = *(undefined2 *)&in_RDI->field_0x12;
  (*peVar4->_vptr_Core[0x5c])(local_b0,peVar4,(ulong)local_b4);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33f774);
  if (bVar2) {
    local_c4 = 200;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_c0,&local_c4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)__rtime);
    peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x33f7bc);
    local_11c._0_1_ = in_RDI->respondedToCommand;
    local_11c._1_1_ = in_RDI->hasPotentialTargetting;
    local_11c._2_2_ = *(undefined2 *)&in_RDI->field_0x12;
    (*peVar4->_vptr_Core[0x5c])(local_118,peVar4,(ulong)local_11c);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffe00);
  }
  while (bVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x33f837), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
    ::operator->((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                  *)0x33f850);
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffe00,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffdf8);
    PotentialInterfacesManager::processCommand(in_stack_00000300,in_stack_000002f8);
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffe00);
    peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x33f89b);
    uVar1._0_1_ = in_RDI->respondedToCommand;
    uVar1._1_1_ = in_RDI->hasPotentialTargetting;
    uVar1._2_2_ = *(undefined2 *)&in_RDI->field_0x12;
    (*peVar4->_vptr_Core[0x5c])(local_1a0,peVar4,(ulong)uVar1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffe00);
  }
  this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&(in_RDI->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_3c = 3;
  local_40 = 5;
  local_38 = (size_t *)this_00;
  local_44 = CLI::std::operator&(seq_cst,__memory_order_mask);
  local_48 = local_3c;
  if (local_40 == 3) {
    *(undefined4 *)&(this_00->first)._M_dataplus._M_p = local_3c;
  }
  else if (local_40 == 5) {
    LOCK();
    *(undefined4 *)&(this_00->first)._M_dataplus._M_p = local_3c;
    UNLOCK();
  }
  else {
    *(undefined4 *)&(this_00->first)._M_dataplus._M_p = local_3c;
  }
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(this_00);
  return;
}

Assistant:

void Federate::potentialInterfacesStartupSequence()
{
    if (potManager) {
        switch (potInterfacesSequence.load()) {
            case 0:
                potManager->initialize();
                potInterfacesSequence.store(1);
                [[fallthrough]];
            case 1:
                coreObject->enterInitializingMode(fedID, helics::IterationRequest::FORCE_ITERATION);
                potInterfacesSequence.store(2);
                [[fallthrough]];
            case 2: {
                // respond to query
                coreObject->enterInitializingMode(fedID, helics::IterationRequest::FORCE_ITERATION);
                // now check for commands
                auto cmd = coreObject->getCommand(fedID);
                if (cmd.first.empty()) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    cmd = coreObject->getCommand(fedID);
                }
                while (!cmd.first.empty()) {
                    potManager->processCommand(std::move(cmd));
                    cmd = coreObject->getCommand(fedID);
                }
                potInterfacesSequence.store(3);
            } break;
            default:
                break;
        }
    }
}